

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_stbvorbis_ds_get_length(ma_data_source *pDataSource,ma_uint64 *pLength)

{
  ma_result mVar1;
  ma_stbvorbis *in_stack_ffffffffffffffe8;
  
  mVar1 = ma_stbvorbis_get_length_in_pcm_frames(in_stack_ffffffffffffffe8,(ma_uint64 *)0x213e3d);
  return mVar1;
}

Assistant:

static ma_result ma_stbvorbis_ds_get_length(ma_data_source* pDataSource, ma_uint64* pLength)
{
    return ma_stbvorbis_get_length_in_pcm_frames((ma_stbvorbis*)pDataSource, pLength);
}